

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

void mark_all(Vm *vm)

{
  CallFrame *pCVar1;
  CrispyValue *pCVar2;
  int local_44;
  int k;
  CrispyValue *value_1;
  int j_1;
  CrispyValue *value;
  int j;
  CallFrame *curr_frame;
  int i;
  Vm *vm_local;
  
  curr_frame._4_4_ = vm->frame_count;
  while (curr_frame._4_4_ = curr_frame._4_4_ - 1, -1 < (int)curr_frame._4_4_) {
    pCVar1 = (vm->frames).frame_pointers[(int)curr_frame._4_4_];
    for (value._4_4_ = 0; (ulong)(long)value._4_4_ < (pCVar1->variables).count;
        value._4_4_ = value._4_4_ + 1) {
      pCVar2 = (pCVar1->variables).values + value._4_4_;
      if (pCVar2->type == OBJECT) {
        mark((pCVar2->field_1).o_value);
      }
    }
    for (value_1._4_4_ = 0; (ulong)(long)value_1._4_4_ < (pCVar1->constants).count;
        value_1._4_4_ = value_1._4_4_ + 1) {
      pCVar2 = (pCVar1->constants).values + value_1._4_4_;
      if (pCVar2->type == OBJECT) {
        mark((pCVar2->field_1).o_value);
      }
    }
    for (local_44 = 0; (long)local_44 < (long)vm->sp - (long)vm >> 4; local_44 = local_44 + 1) {
      if (vm->stack[local_44].type == OBJECT) {
        mark(vm->stack[local_44].field_1.o_value);
      }
    }
  }
  return;
}

Assistant:

static void mark_all(Vm *vm) {
    for (int i = vm->frame_count - 1; i >= 0; --i) {
        CallFrame *curr_frame = vm->frames.frame_pointers[i];

        // variables
        for (int j = 0; j < curr_frame->variables.count; ++j) {
            CrispyValue *value = &curr_frame->variables.values[j];

            // TODO check reason for uinitcondition warning in valgrind
            if (value->type == OBJECT) {
                mark(value->o_value);
            }
        }

        // constants
        for (int j = 0; j < curr_frame->constants.count; ++j) {
            CrispyValue *value = &curr_frame->constants.values[j];

            if (value->type == OBJECT) {
                mark(value->o_value);
            }
        }

        // stack
        for (int k = 0; k < vm->sp - vm->stack; k++) {
            if (vm->stack[k].type == OBJECT) {
                mark(vm->stack[k].o_value);
            }
        }
    }
}